

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
__thiscall
testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
          (testing *this,
          vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> RVar1;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_30;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *local_18;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *value_local;
  
  local_18 = value;
  value_local = (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)this;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_30,value);
  internal::
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>::
  ReturnAction((ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                *)this,&local_30);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector(&local_30);
  RVar1.value_.
  super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.value_.
  super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
          )RVar1.value_.
           super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}